

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pr.cpp
# Opt level: O2

int main(void)

{
  id local_1a8;
  string tid;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  local_1a8._M_thread = pthread_self();
  tid_to_string_abi_cxx11_(&tid,&local_1a8);
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] tid is:%s\n","info","main",0x12,tid._M_dataplus._M_p);
  }
  pr_set_level(3);
  pr_test("debug");
  pr_set_level(2);
  pr_test("info");
  pr_set_level(1);
  pr_test("warn");
  pr_set_level(0);
  pr_test("error");
  std::__cxx11::string::~string((string *)&tid);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return 0;
}

Assistant:

int main()
{
    ostringstream oss;
    string tid = tid_to_string(this_thread::get_id());
    PR_INFO("tid is:%s\n", tid.c_str());

    pr_set_level(PR_LEVEL_DEBUG);
    pr_test("debug");

    pr_set_level(PR_LEVEL_INFO);
    pr_test("info");

    pr_set_level(PR_LEVEL_WARN);
    pr_test("warn");

    pr_set_level(PR_LEVEL_ERROR);
    pr_test("error");

    return 0;
}